

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O1

void __thiscall
SQLite::Database::Database
          (Database *this,string *aFilename,int aFlags,int aBusyTimeoutMs,string *aVfs)

{
  pointer pcVar1;
  int ret;
  runtime_error *this_00;
  char *zVfs;
  Exception exception;
  Exception local_48;
  
  this->mpSQLite = (sqlite3 *)0x0;
  (this->mFilename)._M_dataplus._M_p = (pointer)&(this->mFilename).field_2;
  pcVar1 = (aFilename->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->mFilename,pcVar1,pcVar1 + aFilename->_M_string_length);
  zVfs = (char *)aVfs->_M_string_length;
  if (zVfs != (char *)0x0) {
    zVfs = (aVfs->_M_dataplus)._M_p;
  }
  ret = sqlite3_open_v2((aFilename->_M_dataplus)._M_p,&this->mpSQLite,aFlags,zVfs);
  if (ret == 0) {
    if (0 < aBusyTimeoutMs) {
      setBusyTimeout(this,aBusyTimeoutMs);
    }
    return;
  }
  Exception::Exception(&local_48,this->mpSQLite,ret);
  sqlite3_close(this->mpSQLite);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x18);
  std::runtime_error::runtime_error(this_00,&local_48.super_runtime_error);
  *(undefined ***)this_00 = &PTR__runtime_error_001a32e8;
  *(undefined8 *)(this_00 + 0x10) = local_48._16_8_;
  __cxa_throw(this_00,&Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Database::Database(const std::string& aFilename,
                   const int          aFlags         /* = SQLite::OPEN_READONLY*/,
                   const int          aBusyTimeoutMs /* = 0 */,
                   const std::string& aVfs           /* = "" */) :
    mpSQLite(nullptr),
    mFilename(aFilename)
{
    const int ret = sqlite3_open_v2(aFilename.c_str(), &mpSQLite, aFlags, aVfs.empty() ? nullptr : aVfs.c_str());
    if (SQLITE_OK != ret)
    {
        const SQLite::Exception exception(mpSQLite, ret); // must create before closing
        sqlite3_close(mpSQLite); // close is required even in case of error on opening
        throw exception;
    }
    if (aBusyTimeoutMs > 0)
    {
        setBusyTimeout(aBusyTimeoutMs);
    }
}